

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t
decoder_peek_si_internal
          (uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si,int *is_intra_only)

{
  char cVar1;
  int iVar2;
  aom_codec_err_t aVar3;
  int iVar4;
  undefined4 *in_RCX;
  int *in_RDX;
  ulong in_RSI;
  aom_read_bit_buffer *in_RDI;
  FRAME_TYPE frame_type;
  int show_existing_frame;
  aom_read_bit_buffer rb_1;
  int max_frame_height;
  int max_frame_width;
  int num_bits_height;
  int num_bits_width;
  uint8_t still_picture;
  aom_read_bit_buffer rb;
  aom_codec_err_t status;
  uint8_t reduced_still_picture_hdr;
  size_t bytes_read;
  size_t payload_size;
  ObuHeader obu_header;
  int found_keyframe;
  int got_sequence_header;
  int intra_only_flag;
  int in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  aom_read_bit_buffer *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  aom_read_bit_buffer *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  aom_read_bit_buffer *in_stack_ffffffffffffff68;
  ObuHeader *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  char local_69;
  undefined1 local_58 [8];
  char local_50;
  int local_34;
  int local_30;
  undefined4 local_2c;
  undefined4 *local_28;
  int *local_20;
  ulong local_18;
  aom_read_bit_buffer *local_10;
  aom_codec_err_t local_4;
  
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  if ((in_RDI < (aom_read_bit_buffer *)((long)&in_RDI->bit_buffer + in_RSI)) && (in_RSI != 0)) {
    *in_RDX = 0;
    in_RDX[1] = 0;
    in_RDX[2] = 0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(local_58,0,0x20);
    local_69 = '\0';
    local_4 = aom_read_obu_header_and_size
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                         (size_t *)in_stack_ffffffffffffff68,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (local_4 == AOM_CODEC_OK) {
      if (local_50 != '\x02') goto LAB_011efef5;
      local_4 = aom_read_obu_header_and_size
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                           (size_t *)in_stack_ffffffffffffff68,
                           (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      while (local_4 == AOM_CODEC_OK) {
LAB_011efef5:
        if (local_50 == '\x01') {
          if (local_18 < 2) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          in_stack_ffffffffffffff70 = (ObuHeader *)((long)&local_10->bit_buffer + local_18);
          in_stack_ffffffffffffff80 = 0;
          in_stack_ffffffffffffff88 = (uint8_t *)0x0;
          in_stack_ffffffffffffff68 = local_10;
          av1_read_profile((aom_read_bit_buffer *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          iVar2 = aom_rb_read_bit(in_stack_ffffffffffffff28);
          in_stack_ffffffffffffff64 = CONCAT13((char)iVar2,(int3)in_stack_ffffffffffffff64);
          iVar2 = aom_rb_read_bit(in_stack_ffffffffffffff28);
          local_69 = (char)iVar2;
          if (((char)((uint)in_stack_ffffffffffffff64 >> 0x18) == '\0') && (local_69 != '\0')) {
            return AOM_CODEC_UNSUP_BITSTREAM;
          }
          aVar3 = parse_operating_points
                            (in_stack_ffffffffffffff48,
                             (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                             (aom_codec_stream_info_t *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          if (aVar3 != AOM_CODEC_OK) {
            return aVar3;
          }
          in_stack_ffffffffffffff60 =
               aom_rb_read_literal((aom_read_bit_buffer *)
                                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff1c);
          in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1;
          aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c);
          iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff1c);
          iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      in_stack_ffffffffffffff1c);
          *local_20 = iVar2 + 1;
          local_20[1] = iVar4 + 1;
          local_30 = 1;
        }
        else if ((local_50 == '\x03') || (local_50 == '\x06')) {
          if ((local_30 != 0) && (local_69 != '\0')) {
            local_34 = 1;
            goto LAB_011f023d;
          }
          if (local_18 == 0) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          in_stack_ffffffffffffff38 = 0;
          in_stack_ffffffffffffff40 = 0;
          in_stack_ffffffffffffff48 = (aom_read_bit_buffer *)0x0;
          in_stack_ffffffffffffff28 = local_10;
          in_stack_ffffffffffffff24 = aom_rb_read_bit(local_10);
          if (in_stack_ffffffffffffff24 == 0) {
            iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)(ulong)in_stack_ffffffffffffff20,
                                        in_stack_ffffffffffffff1c);
            cVar1 = (char)iVar2;
            in_stack_ffffffffffffff20 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffff20);
            if (cVar1 == '\0') {
              local_34 = 1;
              goto LAB_011f023d;
            }
            if (cVar1 == '\x02') {
              local_2c = 1;
            }
          }
        }
        if (local_18 == 0) {
LAB_011f023d:
          if ((local_30 != 0) && (local_34 != 0)) {
            local_20[2] = 1;
          }
          if (local_28 != (undefined4 *)0x0) {
            *local_28 = local_2c;
          }
          return AOM_CODEC_OK;
        }
        local_4 = aom_read_obu_header_and_size
                            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                             (size_t *)in_stack_ffffffffffffff68,
                             (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                            );
      }
    }
  }
  else {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t decoder_peek_si_internal(const uint8_t *data,
                                                size_t data_sz,
                                                aom_codec_stream_info_t *si,
                                                int *is_intra_only) {
  int intra_only_flag = 0;
  int got_sequence_header = 0;
  int found_keyframe = 0;

  if (data + data_sz <= data || data_sz < 1) return AOM_CODEC_INVALID_PARAM;

  si->w = 0;
  si->h = 0;
  si->is_kf = 0;  // is_kf indicates whether the current packet contains a RAP

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t payload_size = 0;
  size_t bytes_read = 0;
  uint8_t reduced_still_picture_hdr = 0;
  aom_codec_err_t status = aom_read_obu_header_and_size(
      data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
  if (status != AOM_CODEC_OK) return status;

  // If the first OBU is a temporal delimiter, skip over it and look at the next
  // OBU in the bitstream
  if (obu_header.type == OBU_TEMPORAL_DELIMITER) {
    // Skip any associated payload (there shouldn't be one, but just in case)
    if (data_sz < bytes_read + payload_size) return AOM_CODEC_CORRUPT_FRAME;
    data += bytes_read + payload_size;
    data_sz -= bytes_read + payload_size;

    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  while (1) {
    data += bytes_read;
    data_sz -= bytes_read;
    if (data_sz < payload_size) return AOM_CODEC_CORRUPT_FRAME;
    // Check that the selected OBU is a sequence header
    if (obu_header.type == OBU_SEQUENCE_HEADER) {
      // Sanity check on sequence header size
      if (data_sz < 2) return AOM_CODEC_CORRUPT_FRAME;
      // Read a few values from the sequence header payload
      struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };

      av1_read_profile(&rb);  // profile
      const uint8_t still_picture = aom_rb_read_bit(&rb);
      reduced_still_picture_hdr = aom_rb_read_bit(&rb);

      if (!still_picture && reduced_still_picture_hdr) {
        return AOM_CODEC_UNSUP_BITSTREAM;
      }

      status = parse_operating_points(&rb, reduced_still_picture_hdr, si);
      if (status != AOM_CODEC_OK) return status;

      int num_bits_width = aom_rb_read_literal(&rb, 4) + 1;
      int num_bits_height = aom_rb_read_literal(&rb, 4) + 1;
      int max_frame_width = aom_rb_read_literal(&rb, num_bits_width) + 1;
      int max_frame_height = aom_rb_read_literal(&rb, num_bits_height) + 1;
      si->w = max_frame_width;
      si->h = max_frame_height;
      got_sequence_header = 1;
    } else if (obu_header.type == OBU_FRAME_HEADER ||
               obu_header.type == OBU_FRAME) {
      if (got_sequence_header && reduced_still_picture_hdr) {
        found_keyframe = 1;
        break;
      } else {
        // make sure we have enough bits to get the frame type out
        if (data_sz < 1) return AOM_CODEC_CORRUPT_FRAME;
        struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };
        const int show_existing_frame = aom_rb_read_bit(&rb);
        if (!show_existing_frame) {
          const FRAME_TYPE frame_type = (FRAME_TYPE)aom_rb_read_literal(&rb, 2);
          if (frame_type == KEY_FRAME) {
            found_keyframe = 1;
            break;  // Stop here as no further OBUs will change the outcome.
          } else if (frame_type == INTRA_ONLY_FRAME) {
            intra_only_flag = 1;
          }
        }
      }
    }
    // skip past any unread OBU header data
    data += payload_size;
    data_sz -= payload_size;
    if (data_sz == 0) break;  // exit if we're out of OBUs
    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  if (got_sequence_header && found_keyframe) si->is_kf = 1;
  if (is_intra_only != NULL) *is_intra_only = intra_only_flag;
  return AOM_CODEC_OK;
}